

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_SWEEP(effect_handler_context_t *context)

{
  int iVar1;
  wchar_t wVar2;
  undefined4 extraout_var;
  loc grid;
  monster *pmVar3;
  long lVar4;
  _Bool fear;
  _Bool local_3d;
  anon_enum_32 local_3c;
  ulong local_38;
  
  wVar2 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  local_38 = CONCAT44(extraout_var,wVar2);
  local_3c = (context->origin).what;
  if (L'\0' < wVar2 && local_3c == SRC_PLAYER) {
    do {
      lVar4 = 0;
      do {
        grid = (loc)loc_sum(player->grid,(loc_conflict)clockwise_grid[lVar4]);
        pmVar3 = square_monster(cave,grid);
        if (pmVar3 != (monster *)0x0) {
          py_attack_real(player,grid,&local_3d);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      iVar1 = (int)local_38;
      local_38 = (ulong)(iVar1 - 1);
    } while (1 < iVar1);
  }
  return local_3c == SRC_PLAYER;
}

Assistant:

bool effect_handler_SWEEP(effect_handler_context_t *context)
{
	int blows = effect_calculate_value(context, false);
	bool fear;
	int i;
	struct loc target;

	/* Players only for now */
	if (context->origin.what != SRC_PLAYER)	return false;

	/* Doing these like >1 blows means spinning around multiple times. */
	while (blows-- > 0) {
		for (i = 0; i < 8; i++) {
			target = loc_sum(player->grid, clockwise_grid[i]);
			if (square_monster(cave, target) != NULL)
				py_attack_real(player, target, &fear);
		}
	}

	/* Should return some energy if all enemies killed and blows remain? */
	return true;
}